

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O1

int qc_poll_remove(QcPoll *poll,unsigned_long index)

{
  ulong uVar1;
  pollfd *ppVar2;
  
  if (poll == (QcPoll *)0x0) {
    qc_poll_remove_cold_3();
  }
  else if (index != 0) {
    if (index <= poll->num) {
      qc_poll_remove_cold_1();
    }
    uVar1 = poll->num;
    if (index < uVar1) {
      ppVar2 = poll->fdarray;
      do {
        ppVar2[index - 1] = ppVar2[index];
        index = index + 1;
      } while (uVar1 != index);
    }
    poll->num = uVar1 - 1;
    return 0;
  }
  qc_poll_remove_cold_2();
  return (int)poll->num;
}

Assistant:

int qc_poll_remove(QcPoll *poll, unsigned long index)
{
    unsigned long i;

    qc_assert(poll);
    qc_assert(index>0);
    qc_assert(poll->num < index);

    for(i = index; i<poll->num; i++)
    {
        poll->fdarray[i-1].fd = poll->fdarray[i].fd;
        poll->fdarray[i-1].events  = poll->fdarray[i].events;
        poll->fdarray[i-1].revents = poll->fdarray[i].revents;
    }

    poll->num--;
    return 0;
}